

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmintegration.cpp
# Opt level: O1

QKmsDevice * __thiscall QEglFSKmsGbmIntegration::createDevice(QEglFSKmsGbmIntegration *this)

{
  QTextStream *pQVar1;
  QDebug QVar2;
  Stream *__old_val;
  long lVar3;
  QDeviceDiscovery *pQVar4;
  QEglFSKmsGbmDevice *this_00;
  QKmsScreenConfig *screenConfig;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebug local_c0;
  QDebug local_b8;
  QtPrivate local_b0 [8];
  QArrayDataPointer<QString> local_a8;
  QEglFSKmsGbmIntegration local_88;
  undefined8 local_70;
  QString local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.size = -0x5555555555555556;
  local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  lVar3 = QEglFSKmsIntegration::screenConfig();
  local_68.d.d = *(Data **)(lVar3 + 8);
  local_68.d.ptr = *(char16_t **)(lVar3 + 0x10);
  local_68.d.size = *(long *)(lVar3 + 0x18);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_68.d.size == 0) {
    pQVar4 = QDeviceDiscovery::create((QDeviceTypes)0x10,(QObject *)0x0);
    local_a8.size = -0x5555555555555556;
    local_a8.d._0_4_ = 0xaaaaaaaa;
    local_a8.d._4_4_ = 0xaaaaaaaa;
    local_a8.ptr._0_4_ = 0xaaaaaaaa;
    local_a8.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)pQVar4 + 0x60))(&local_a8,pQVar4);
    lVar3 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
      local_70 = *(undefined8 *)(lVar3 + 8);
      local_88.super_QEglFSKmsIntegration = (QEglFSKmsIntegration)0x2;
      local_88._1_3_ = 0;
      local_88._4_8_ = 0;
      local_88._12_8_ = 0;
      local_88._20_4_ = 0;
      QMessageLogger::debug();
      QVar2.stream = local_c0.stream;
      QVar8.m_data = (storage_type *)0x22;
      QVar8.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar2.stream,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_c0.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_c0.stream,' ');
      }
      *(int *)(local_c0.stream + 0x28) = *(int *)(local_c0.stream + 0x28) + 1;
      local_b8.stream = (Stream *)0x0;
      local_50.d.d = (Data *)local_c0.stream;
      QtPrivate::printSequentialContainer<QList<QString>>
                (local_b0,(Stream *)&local_50,"QList",(QList<QString> *)&local_a8);
      QDebug::~QDebug((QDebug *)&local_50);
      QDebug::~QDebug((QDebug *)local_b0);
      QDebug::~QDebug(&local_b8);
      QDebug::~QDebug(&local_c0);
    }
    QObject::deleteLater();
    if (local_a8.size == 0) {
      createDevice(&local_88);
      goto LAB_001126b5;
    }
    QString::operator=(&local_68,(QString *)CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_));
    lVar3 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
      local_70 = *(undefined8 *)(lVar3 + 8);
      local_88.super_QEglFSKmsIntegration = (QEglFSKmsIntegration)0x2;
      local_88._1_3_ = 0;
      local_88._4_8_ = 0;
      local_88._12_8_ = 0;
      local_88._20_4_ = 0;
      QMessageLogger::debug();
      QVar2.stream = local_c0.stream;
      QVar9.m_data = (storage_type *)0x5;
      QVar9.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)QVar2.stream,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_c0.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_c0.stream,' ');
      }
      pcVar5 = local_68.d.ptr;
      if (local_68.d.ptr == (char16_t *)0x0) {
        pcVar5 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_c0,(ulong)pcVar5);
      if ((char)(((QArrayData *)(local_c0.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_c0.stream,' ');
      }
      QDebug::~QDebug(&local_c0);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  }
  else {
    lVar3 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar3 + 0x10) & 1) != 0) {
      local_70 = *(undefined8 *)(lVar3 + 8);
      local_88.super_QEglFSKmsIntegration = (QEglFSKmsIntegration)0x2;
      local_88._1_3_ = 0;
      local_88._4_8_ = 0;
      local_88._12_8_ = 0;
      local_88._20_4_ = 0;
      QMessageLogger::debug();
      pQVar1 = (QTextStream *)CONCAT44(local_a8.d._4_4_,local_a8.d._0_4_);
      QVar6.m_data = (storage_type *)0x15;
      QVar6.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<(pQVar1,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)CONCAT44(local_a8.d._4_4_,local_a8.d._0_4_))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT44(local_a8.d._4_4_,local_a8.d._0_4_),' ');
      }
      pcVar5 = local_68.d.ptr;
      if (local_68.d.ptr == (char16_t *)0x0) {
        pcVar5 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_a8,(ulong)pcVar5);
      if (((QTextStream *)CONCAT44(local_a8.d._4_4_,local_a8.d._0_4_))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT44(local_a8.d._4_4_,local_a8.d._0_4_),' ');
      }
      pQVar1 = (QTextStream *)CONCAT44(local_a8.d._4_4_,local_a8.d._0_4_);
      QVar7.m_data = (storage_type *)0x18;
      QVar7.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<(pQVar1,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)CONCAT44(local_a8.d._4_4_,local_a8.d._0_4_))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT44(local_a8.d._4_4_,local_a8.d._0_4_),' ');
      }
      QDebug::~QDebug((QDebug *)&local_a8);
    }
  }
  this_00 = (QEglFSKmsGbmDevice *)operator_new(0x70);
  screenConfig = (QKmsScreenConfig *)QEglFSKmsIntegration::screenConfig();
  QEglFSKmsGbmDevice::QEglFSKmsGbmDevice(this_00,screenConfig,&local_68);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QKmsDevice *)this_00;
  }
LAB_001126b5:
  __stack_chk_fail();
}

Assistant:

QKmsDevice *QEglFSKmsGbmIntegration::createDevice()
{
    QString path = screenConfig()->devicePath();
    if (!path.isEmpty()) {
        qCDebug(qLcEglfsKmsDebug) << "GBM: Using DRM device" << path << "specified in config file";
    } else {
        QDeviceDiscovery *d = QDeviceDiscovery::create(QDeviceDiscovery::Device_VideoMask);
        const QStringList devices = d->scanConnectedDevices();
        qCDebug(qLcEglfsKmsDebug) << "Found the following video devices:" << devices;
        d->deleteLater();

        if (Q_UNLIKELY(devices.isEmpty()))
            qFatal("Could not find DRM device!");

        path = devices.first();
        qCDebug(qLcEglfsKmsDebug) << "Using" << path;
    }

    return new QEglFSKmsGbmDevice(screenConfig(), path);
}